

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::anon_unknown_36::WebSocketImpl::setUpSendingControlMessage(WebSocketImpl *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *dependencyParam;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar1;
  long lVar2;
  OwnPromiseNode node;
  void *pvVar3;
  PromiseNode *ptrCopy;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_50;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_48;
  undefined *local_40;
  undefined8 local_38;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_30;
  
  dependencyParam = &(this->sendingControlMessage).ptr.field_1;
  if ((this->sendingControlMessage).ptr.isSet == true) {
    aVar1.value.super_PromiseBase.node.ptr = *(Promise<void> *)dependencyParam;
    lVar2 = *(long *)((long)aVar1 + 8);
    if (lVar2 == 0 || (ulong)((long)aVar1 - lVar2) < 0x28) {
      pvVar3 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&dependencyParam->value,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3660:44)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_006d7168;
      *(WebSocketImpl **)((long)pvVar3 + 0x3f8) = this;
      *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
    }
    else {
      *(undefined8 *)((long)aVar1 + 8) = 0;
      this_00 = (TransformPromiseNodeBase *)((long)aVar1 + -0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&dependencyParam->value,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3660:44)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)aVar1 + -0x28) = &PTR_destroy_006d7168;
      *(WebSocketImpl **)((long)aVar1 + -8) = this;
      *(long *)((long)aVar1 + -0x20) = lVar2;
    }
    local_48 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)&DAT_004ddfe0;
    local_40 = &DAT_004de03f;
    local_38 = 0x4c0000058b;
    local_50.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_30.value,&local_50,(SourceLocation *)&local_48.value);
    node.ptr = local_50.ptr;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    if ((this->sendingControlMessage).ptr.isSet == true) {
      (this->sendingControlMessage).ptr.isSet = false;
      aVar1 = (this->sendingControlMessage).ptr.field_1;
      if (aVar1 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
        *dependencyParam = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
      }
    }
    (this->sendingControlMessage).ptr.field_1 = local_30;
  }
  else {
    writeQueuedControlMessage((WebSocketImpl *)&local_48.value);
    if ((this->sendingControlMessage).ptr.isSet == true) {
      (this->sendingControlMessage).ptr.isSet = false;
      aVar1 = (this->sendingControlMessage).ptr.field_1;
      if (aVar1 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
        *dependencyParam = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
      }
    }
    (this->sendingControlMessage).ptr.field_1 = local_48;
  }
  (this->sendingControlMessage).ptr.isSet = true;
  return;
}

Assistant:

void setUpSendingControlMessage() {
    KJ_IF_SOME(promise, sendingControlMessage) {
      sendingControlMessage = promise.then([this]() mutable {
        return writeQueuedControlMessage();
      });
    } else {
      sendingControlMessage = writeQueuedControlMessage();
    }
  }